

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O3

bool tinyusdz::tydra::GetBoundMaterial
               (Stage *_stage,Path *abs_path,string *materialPurpose,Path *materialPath,
               Material **material,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Material *pMVar3;
  bool bVar4;
  bool bVar5;
  string *purpose_00;
  uint uVar6;
  Token *purpose;
  Prim *prim;
  Material *directMaterial;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> purposes;
  string _err;
  Path parentPath;
  Path boundMaterialPath;
  Path currentPath;
  Prim *local_348;
  Material *local_340;
  Stage *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  Material *local_310;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_308;
  string local_2f0;
  Path local_2d0;
  Path *local_200;
  Material **local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  Prim *local_1e0;
  Path *local_1d8;
  Path local_1d0;
  Path local_100;
  
  if (material == (Material **)0x0 || materialPath == (Path *)0x0) {
    bVar5 = false;
  }
  else {
    local_308.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar2 = &local_100._prim_part.field_2;
    local_200 = materialPath;
    local_1f8 = material;
    local_1d8 = abs_path;
    if (materialPurpose->_M_string_length != 0) {
      local_100._prim_part._M_string_length = 0;
      local_100._prim_part.field_2._M_local_buf[0] = '\0';
      local_100._prim_part._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_assign((string *)&local_100);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
      emplace_back<tinyusdz::Token>(&local_308,(Token *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_100._prim_part._M_dataplus._M_p,
                        CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                 local_100._prim_part.field_2._M_local_buf[0]) + 1);
      }
    }
    local_100._prim_part._M_string_length = 0;
    local_100._prim_part.field_2._M_local_buf[0] = '\0';
    local_100._prim_part._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,0x5f3bf3);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::emplace_back<tinyusdz::Token>
              (&local_308,(Token *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._prim_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._prim_part._M_dataplus._M_p,
                      CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_100._prim_part.field_2._M_local_buf[0]) + 1);
    }
    local_348 = (Prim *)local_308.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    local_1e0 = (Prim *)local_308.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
    if (local_308.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_308.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_318 = &local_1d0._variant_part_str.field_2;
      local_320 = &local_1d0._element.field_2;
      paVar1 = &local_2d0._variant_part_str.field_2;
      paVar2 = &local_2d0._element.field_2;
      local_1f0 = &local_100._element.field_2;
      local_1e8 = &local_100._variant_part_str.field_2;
      bVar5 = false;
      do {
        Path::Path(&local_100,local_1d8);
        local_1d0._prim_part._M_dataplus._M_p = (pointer)&local_1d0._prim_part.field_2;
        local_1d0._prim_part._M_string_length = 0;
        local_1d0._prim_part.field_2._M_local_buf[0] = '\0';
        local_1d0._prop_part._M_dataplus._M_p = (pointer)&local_1d0._prop_part.field_2;
        local_1d0._prop_part._M_string_length = 0;
        local_1d0._prop_part.field_2._M_local_buf[0] = '\0';
        local_1d0._variant_part._M_dataplus._M_p = (pointer)&local_1d0._variant_part.field_2;
        local_1d0._variant_part._M_string_length = 0;
        local_1d0._variant_part.field_2._M_local_buf[0] = '\0';
        local_1d0._variant_selection_part._M_dataplus._M_p =
             (pointer)&local_1d0._variant_selection_part.field_2;
        local_1d0._variant_selection_part._M_string_length = 0;
        local_1d0._variant_selection_part.field_2._M_local_buf[0] = '\0';
        local_1d0._variant_part_str._M_dataplus._M_p = (pointer)local_318;
        local_1d0._variant_part_str._M_string_length = 0;
        local_1d0._variant_part_str.field_2._M_local_buf[0] = '\0';
        local_1d0._element._M_dataplus._M_p = (pointer)local_320;
        local_1d0._element._M_string_length = 0;
        local_1d0._element.field_2._M_local_buf[0] = '\0';
        local_1d0._path_type.has_value_ = false;
        local_1d0._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_1d0._valid = false;
        uVar6 = 0xffffffff;
        local_340 = (Material *)0x0;
        do {
          uVar6 = uVar6 + 1;
          if (((0x1ffff < uVar6) || (local_100._valid != true)) ||
             ((local_100._prim_part._M_string_length == 1 &&
              (*local_100._prim_part._M_dataplus._M_p == '/')))) break;
          local_328 = (Stage *)0x0;
          purpose_00 = err;
          bVar4 = Stage::find_prim_at_path(_stage,&local_100,(Prim **)&local_328,err);
          if (!bVar4) {
            bVar5 = false;
            goto LAB_005a166a;
          }
          if ((local_340 == (Material *)0x0) ||
             (bVar4 = DirectBindingStrongerThanDescendants
                                ((tydra *)_stage,local_328,local_348,purpose_00), bVar4)) {
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            local_2f0._M_string_length = 0;
            local_2f0.field_2._M_local_buf[0] = '\0';
            local_2d0._prim_part._M_dataplus._M_p = (pointer)&local_2d0._prim_part.field_2;
            local_2d0._prim_part._M_string_length = 0;
            local_2d0._prim_part.field_2._M_local_buf[0] = '\0';
            local_2d0._prop_part._M_dataplus._M_p = (pointer)&local_2d0._prop_part.field_2;
            local_2d0._prop_part._M_string_length = 0;
            local_2d0._prop_part.field_2._M_local_buf[0] = '\0';
            local_2d0._variant_part._M_dataplus._M_p = (pointer)&local_2d0._variant_part.field_2;
            local_2d0._variant_part._M_string_length = 0;
            local_2d0._variant_part.field_2._M_local_buf[0] = '\0';
            local_2d0._variant_selection_part._M_dataplus._M_p =
                 (pointer)&local_2d0._variant_selection_part.field_2;
            local_2d0._variant_selection_part._M_string_length = 0;
            local_2d0._variant_selection_part.field_2._M_local_buf[0] = '\0';
            local_2d0._variant_part_str._M_string_length = 0;
            local_2d0._variant_part_str.field_2._M_local_buf[0] = '\0';
            local_2d0._element._M_string_length = 0;
            local_2d0._element.field_2._M_local_buf[0] = '\0';
            local_2d0._path_type.has_value_ = false;
            local_2d0._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_2d0._valid = false;
            local_310 = (Material *)0x0;
            local_2d0._variant_part_str._M_dataplus._M_p = (pointer)paVar1;
            local_2d0._element._M_dataplus._M_p = (pointer)paVar2;
            bVar4 = GetDirectlyBoundMaterial
                              (_stage,(Prim *)local_328,(string *)local_348,&local_2d0,&local_310,
                               &local_2f0);
            pMVar3 = local_310;
            if (local_310 == (Material *)0x0 || !bVar4) {
              bVar4 = local_2f0._M_string_length == 0;
              if (err == (string *)0x0 || bVar4) {
                bVar5 = (bool)(bVar5 & bVar4);
              }
              else {
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_2f0._M_dataplus._M_p);
                bVar4 = false;
                bVar5 = false;
              }
            }
            else {
              Path::operator=(&local_1d0,&local_2d0);
              bVar4 = true;
              local_340 = pMVar3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._element._M_dataplus._M_p != paVar2) {
              operator_delete(local_2d0._element._M_dataplus._M_p,
                              CONCAT71(local_2d0._element.field_2._M_allocated_capacity._1_7_,
                                       local_2d0._element.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._variant_part_str._M_dataplus._M_p != paVar1) {
              operator_delete(local_2d0._variant_part_str._M_dataplus._M_p,
                              CONCAT71(local_2d0._variant_part_str.field_2._M_allocated_capacity.
                                       _1_7_,local_2d0._variant_part_str.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._variant_selection_part._M_dataplus._M_p !=
                &local_2d0._variant_selection_part.field_2) {
              operator_delete(local_2d0._variant_selection_part._M_dataplus._M_p,
                              CONCAT71(local_2d0._variant_selection_part.field_2.
                                       _M_allocated_capacity._1_7_,
                                       local_2d0._variant_selection_part.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._variant_part._M_dataplus._M_p != &local_2d0._variant_part.field_2) {
              operator_delete(local_2d0._variant_part._M_dataplus._M_p,
                              CONCAT71(local_2d0._variant_part.field_2._M_allocated_capacity._1_7_,
                                       local_2d0._variant_part.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._prop_part._M_dataplus._M_p != &local_2d0._prop_part.field_2) {
              operator_delete(local_2d0._prop_part._M_dataplus._M_p,
                              CONCAT71(local_2d0._prop_part.field_2._M_allocated_capacity._1_7_,
                                       local_2d0._prop_part.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._prim_part._M_dataplus._M_p != &local_2d0._prim_part.field_2) {
              operator_delete(local_2d0._prim_part._M_dataplus._M_p,
                              CONCAT71(local_2d0._prim_part.field_2._M_allocated_capacity._1_7_,
                                       local_2d0._prim_part.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,
                              CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                                       local_2f0.field_2._M_local_buf[0]) + 1);
            }
            if (!bVar4) goto LAB_005a166a;
          }
          Path::get_parent_prim_path(&local_2d0,&local_100);
          Path::operator=(&local_100,&local_2d0);
          bVar4 = Path::is_root_prim(&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._element._M_dataplus._M_p != paVar2) {
            operator_delete(local_2d0._element._M_dataplus._M_p,
                            CONCAT71(local_2d0._element.field_2._M_allocated_capacity._1_7_,
                                     local_2d0._element.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._variant_part_str._M_dataplus._M_p != paVar1) {
            operator_delete(local_2d0._variant_part_str._M_dataplus._M_p,
                            CONCAT71(local_2d0._variant_part_str.field_2._M_allocated_capacity._1_7_
                                     ,local_2d0._variant_part_str.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._variant_selection_part._M_dataplus._M_p !=
              &local_2d0._variant_selection_part.field_2) {
            operator_delete(local_2d0._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(local_2d0._variant_selection_part.field_2._M_allocated_capacity
                                     ._1_7_,local_2d0._variant_selection_part.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._variant_part._M_dataplus._M_p != &local_2d0._variant_part.field_2) {
            operator_delete(local_2d0._variant_part._M_dataplus._M_p,
                            CONCAT71(local_2d0._variant_part.field_2._M_allocated_capacity._1_7_,
                                     local_2d0._variant_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._prop_part._M_dataplus._M_p != &local_2d0._prop_part.field_2) {
            operator_delete(local_2d0._prop_part._M_dataplus._M_p,
                            CONCAT71(local_2d0._prop_part.field_2._M_allocated_capacity._1_7_,
                                     local_2d0._prop_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._prim_part._M_dataplus._M_p != &local_2d0._prim_part.field_2) {
            operator_delete(local_2d0._prim_part._M_dataplus._M_p,
                            CONCAT71(local_2d0._prim_part.field_2._M_allocated_capacity._1_7_,
                                     local_2d0._prim_part.field_2._M_local_buf[0]) + 1);
          }
        } while (!bVar4);
        if (local_340 == (Material *)0x0) {
          bVar4 = true;
        }
        else {
          *local_1f8 = local_340;
          Path::operator=(local_200,&local_1d0);
          bVar5 = true;
LAB_005a166a:
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._element._M_dataplus._M_p != local_320) {
          operator_delete(local_1d0._element._M_dataplus._M_p,
                          CONCAT71(local_1d0._element.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._element.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._variant_part_str._M_dataplus._M_p != local_318) {
          operator_delete(local_1d0._variant_part_str._M_dataplus._M_p,
                          CONCAT71(local_1d0._variant_part_str.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._variant_part_str.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._variant_selection_part._M_dataplus._M_p !=
            &local_1d0._variant_selection_part.field_2) {
          operator_delete(local_1d0._variant_selection_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._variant_selection_part.field_2._M_allocated_capacity.
                                   _1_7_,local_1d0._variant_selection_part.field_2._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._variant_part._M_dataplus._M_p != &local_1d0._variant_part.field_2) {
          operator_delete(local_1d0._variant_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._variant_part.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._variant_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._prop_part._M_dataplus._M_p != &local_1d0._prop_part.field_2) {
          operator_delete(local_1d0._prop_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._prop_part.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._prop_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._prim_part._M_dataplus._M_p != &local_1d0._prim_part.field_2) {
          operator_delete(local_1d0._prim_part._M_dataplus._M_p,
                          CONCAT71(local_1d0._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_1d0._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._element._M_dataplus._M_p != local_1f0) {
          operator_delete(local_100._element._M_dataplus._M_p,
                          local_100._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part_str._M_dataplus._M_p != local_1e8) {
          operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                          local_100._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_selection_part._M_dataplus._M_p !=
            &local_100._variant_selection_part.field_2) {
          operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                          local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
          operator_delete(local_100._variant_part._M_dataplus._M_p,
                          local_100._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
          operator_delete(local_100._prop_part._M_dataplus._M_p,
                          local_100._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          CONCAT71(local_100._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_100._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar4) goto LAB_005a184b;
        local_348 = (Prim *)&(local_348->_abs_path)._prop_part;
      } while (local_348 != local_1e0);
    }
    bVar5 = false;
LAB_005a184b:
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_308);
  }
  return bVar5;
}

Assistant:

bool GetBoundMaterial(
  const Stage &_stage,
  const Path &abs_path,
  const std::string &materialPurpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (materialPath == nullptr) {
    return false;
  }

  if (material == nullptr) {
    return false;
  }

  std::vector<value::token> purposes;
  if (materialPurpose.empty()) {
    purposes.push_back(value::token("")); // all-purpose
  } else {
    purposes.push_back(value::token(materialPurpose));
    purposes.push_back(value::token("")); // all-purpose
  }

  // for purpose : purposes:
  //
  //   boundMaterial = None
  //
  //   for p = prim, p != Root, p = p.GetParent():
  //
  //     if DirectBindingStrongerThanDescendants(p, purpose) or not boundMaterial:
  //
  //       if dicrectBind = GetDirectlyBoundMaterial(p, purpose):
  //
  //         boundMaterial = directBound
  //
  //     for collBinding : GetCollectionMaterialBindings(p, purpose):
  //
  //       if (collBinding.GetCollection().Contains(prim) and
  //           collBinding.IsStrongerThanDescendants() or not boundMaterial):
  //
  //         boundMaterial = collBinding.GetMaterial()
  //         break
  //
  //
  //   if boundMaterial:
  //     return boundMaterial
  //
  //
  // return False(or return default material)

  for (const auto &purpose : purposes) {

    Path currentPath = abs_path;
    Path boundMaterialPath;
    const Material *boundMaterial{nullptr};

    // We need to climb up to the root in any case.
    // TODO: Cache result.
    uint32_t depth = 0;
    while (depth < 1024*128) { // to avoid infinite loop.

      if (!currentPath.is_valid() || currentPath.is_root_path()) {
        break;
      }

      const Prim *prim{nullptr};
      bool ret = _stage.find_prim_at_path(currentPath, prim, err);
      if (!ret) {
        return false;
      }

      if (!boundMaterial || DirectBindingStrongerThanDescendants(_stage, *prim, purpose.str())) {

        std::string _err;
        Path directMaterialPath;
        const Material *directMaterial{nullptr};
        bool has_directBound = GetDirectlyBoundMaterial(_stage, *prim, purpose.str(), &directMaterialPath, &directMaterial, &_err);

        if (has_directBound && directMaterial) {

          boundMaterial = directMaterial;
          boundMaterialPath = directMaterialPath;
        
        } else if (_err.size()) {
          if (err) {
            (*err) += _err;
          }
          return false;
        }
      }

      Path parentPath = currentPath.get_parent_prim_path();
      DCOUT("search parent: " << parentPath.full_path_name());

      currentPath = parentPath;

      if (currentPath.is_root_prim()) {
        // parent is root('/'), so no need to follow the parent path anymore.
        break;
      }

      depth++;

      // TODO: collection
    }

    if (boundMaterial) {
      (*material) = boundMaterial;
      (*materialPath) = boundMaterialPath;
      return true;
    }
  }

  return false;
}